

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoystickImpl.cpp
# Opt level: O0

JoystickState * __thiscall sf::priv::JoystickImpl::update(JoystickImpl *this)

{
  ssize_t sVar1;
  int *piVar2;
  int *in_RSI;
  JoystickState *in_RDI;
  float fVar3;
  float value;
  int result;
  js_event joyState;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  bool bVar4;
  int local_58;
  undefined1 local_54 [4];
  short local_50;
  byte local_4e;
  byte local_4d;
  undefined1 local_4c [76];
  
  if (*in_RSI < 0) {
    JoystickState::JoystickState
              ((JoystickState *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    memcpy(in_RSI + 0x11,local_4c,0x44);
    memcpy(in_RDI,in_RSI + 0x11,0x44);
  }
  else {
    sVar1 = read(*in_RSI,local_54,8);
    local_58 = (int)sVar1;
    while (0 < local_58) {
      if ((local_4e & 0x7f) == 1) {
        if (local_4d < 0x20) {
          *(bool *)((long)in_RSI + (ulong)local_4d + 0x68) = local_50 != 0;
        }
      }
      else if (((local_4e & 0x7f) == 2) &&
              (fVar3 = ((float)(int)local_50 * 100.0) / 32767.0, local_4d < 0x40)) {
        switch(*(undefined1 *)((long)in_RSI + (ulong)local_4d + 4)) {
        case 0:
          in_RSI[0x12] = (int)fVar3;
          break;
        case 1:
          in_RSI[0x13] = (int)fVar3;
          break;
        case 2:
        case 6:
          in_RSI[0x14] = (int)fVar3;
          break;
        case 3:
          in_RSI[0x16] = (int)fVar3;
          break;
        case 4:
          in_RSI[0x17] = (int)fVar3;
          break;
        case 5:
        case 7:
          in_RSI[0x15] = (int)fVar3;
          break;
        default:
          break;
        case 0x10:
          in_RSI[0x18] = (int)fVar3;
          break;
        case 0x11:
          in_RSI[0x19] = (int)fVar3;
        }
      }
      sVar1 = read(*in_RSI,local_54,8);
      local_58 = (int)sVar1;
    }
    bVar4 = true;
    if (local_58 != 0) {
      piVar2 = __errno_location();
      bVar4 = *piVar2 == 0xb;
    }
    *(bool *)(in_RSI + 0x11) = bVar4;
    memcpy(in_RDI,in_RSI + 0x11,0x44);
  }
  return in_RDI;
}

Assistant:

JoystickState JoystickImpl::JoystickImpl::update()
{
    if (m_file < 0)
    {
        m_state = JoystickState();
        return m_state;
    }

    // pop events from the joystick file
    js_event joyState;
    int result = read(m_file, &joyState, sizeof(joyState));
    while (result > 0)
    {
        switch (joyState.type & ~JS_EVENT_INIT)
        {
            // An axis was moved
            case JS_EVENT_AXIS:
            {
                float value = joyState.value * 100.f / 32767.f;

                if (joyState.number < ABS_MAX + 1)
                {
                    switch (m_mapping[joyState.number])
                    {
                        case ABS_X:        m_state.axes[Joystick::X]    = value; break;
                        case ABS_Y:        m_state.axes[Joystick::Y]    = value; break;
                        case ABS_Z:
                        case ABS_THROTTLE: m_state.axes[Joystick::Z]    = value; break;
                        case ABS_RZ:
                        case ABS_RUDDER:   m_state.axes[Joystick::R]    = value; break;
                        case ABS_RX:       m_state.axes[Joystick::U]    = value; break;
                        case ABS_RY:       m_state.axes[Joystick::V]    = value; break;
                        case ABS_HAT0X:    m_state.axes[Joystick::PovX] = value; break;
                        case ABS_HAT0Y:    m_state.axes[Joystick::PovY] = value; break;
                        default:           break;
                    }
                }
                break;
            }

            // A button was pressed
            case JS_EVENT_BUTTON:
            {
                if (joyState.number < Joystick::ButtonCount)
                    m_state.buttons[joyState.number] = (joyState.value != 0);
                break;
            }
        }

        result = read(m_file, &joyState, sizeof(joyState));
    }

    // Check the connection state of the joystick
    // read() returns -1 and errno != EGAIN if it's no longer connected
    // We need to check the result of read() as well, since errno could
    // have been previously set by some other function call that failed
    // result can be either negative or 0 at this point
    // If result is 0, assume the joystick is still connected
    // If result is negative, check errno and disconnect if it is not EAGAIN
    m_state.connected = (!result || (errno == EAGAIN));

    return m_state;
}